

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

void ps_astar_node2itor(astar_seg_t *itor)

{
  ps_latnode_t *ppVar1;
  int iVar2;
  char *pcVar3;
  ps_seg_t *seg;
  
  iVar2 = itor->cur;
  if (iVar2 < itor->n_nodes) {
    ppVar1 = itor->nodes[iVar2];
    if (iVar2 == itor->n_nodes + -1) {
      iVar2 = ppVar1->lef;
    }
    else {
      iVar2 = itor->nodes[(long)iVar2 + 1]->sf + -1;
    }
    (itor->base).ef = iVar2;
    iVar2 = ppVar1->wid;
    if ((long)iVar2 < 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = ((itor->base).search)->dict->word[iVar2].word;
    }
    (itor->base).text = pcVar3;
    (itor->base).wid = iVar2;
    (itor->base).sf = ppVar1->sf;
    (itor->base).prob = 0;
    return;
  }
  __assert_fail("itor->cur < itor->n_nodes",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x742,"void ps_astar_node2itor(astar_seg_t *)");
}

Assistant:

static void
ps_astar_node2itor(astar_seg_t *itor)
{
    ps_seg_t *seg = (ps_seg_t *)itor;
    ps_latnode_t *node;

    assert(itor->cur < itor->n_nodes);
    node = itor->nodes[itor->cur];
    if (itor->cur == itor->n_nodes - 1)
        seg->ef = node->lef;
    else
        seg->ef = itor->nodes[itor->cur + 1]->sf - 1;
    seg->text = dict_wordstr(ps_search_dict(seg->search), node->wid);
    seg->wid = node->wid;
    seg->sf = node->sf;
    seg->prob = 0; /* FIXME: implement forward-backward */
}